

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_parser.c
# Opt level: O1

uint8_t * get_CHR_bank(uint8_t bank_number)

{
  uint8_t *puVar1;
  
  if (bank_number < parsed_header.CHR_ROM_chunks) {
    puVar1 = CHR_rom_banks[bank_number];
  }
  else {
    puVar1 = (uint8_t *)0x0;
    printf("ERROR: attempted to access CHR rom bank number %u when the max bank number is %u\n",
           (ulong)bank_number,(ulong)(parsed_header.CHR_ROM_chunks - 1));
  }
  return puVar1;
}

Assistant:

uint8_t* get_CHR_bank(uint8_t bank_number) {
    // Account for the -1 in array indexing
    if(bank_number >= parsed_header.CHR_ROM_chunks) {
        printf("ERROR: attempted to access CHR rom bank number %u when the max bank number is %u\n",
               bank_number, parsed_header.CHR_ROM_chunks - 1);
        return NULL;
    }
    return CHR_rom_banks[bank_number];
}